

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void __thiscall ev3dev::sound_sensor::sound_sensor(sound_sensor *this,address_type *address)

{
  bool bVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_11c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11b;
  allocator local_11a;
  allocator local_119;
  lego_port port;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_a8;
  address_type local_88;
  address_type local_68;
  lego_port local_48;
  
  std::__cxx11::string::string((string *)&local_68,(string *)address);
  std::__cxx11::string::string((string *)&port,"lego-nxt-sound",&local_119);
  std::__cxx11::string::string((string *)&port.super_device._device_index,"nxt-analog",&local_11a);
  __l._M_len = 2;
  __l._M_array = (iterator)&port;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_d8,__l,&local_11b,&local_11c);
  sensor::sensor(&this->super_sensor,&local_68,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_d8);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&port.super_device._path._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&local_68);
  if ((this->super_sensor).super_device._path._M_string_length == 0) {
    return;
  }
  sensor::driver_name_abi_cxx11_((string *)&port,&this->super_sensor);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port
                          ,"nxt-analog");
  std::__cxx11::string::~string((string *)&port);
  if (!bVar1) {
    return;
  }
  std::__cxx11::string::string((string *)&local_88,(string *)address);
  lego_port::lego_port(&port,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (port.super_device._path._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_a8,"lego-nxt-sound",(allocator *)&local_d8);
    lego_port::set_set_device(&local_48,&port,&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_a8);
    lego_port::status_abi_cxx11_((string *)&local_d8,&port);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_d8,"lego-nxt-sound");
    std::__cxx11::string::~string((string *)&local_d8);
    if (!bVar1) goto LAB_00111197;
  }
  (this->super_sensor).super_device._path._M_string_length = 0;
  *(this->super_sensor).super_device._path._M_dataplus._M_p = '\0';
LAB_00111197:
  std::__cxx11::string::~string((string *)&port);
  return;
}

Assistant:

sound_sensor::sound_sensor(address_type address)
    : sensor(address, { nxt_sound, nxt_analog })
{
    if (connected() && driver_name() == nxt_analog) {
        lego_port port(address);

        if (port.connected()) {
            port.set_set_device(nxt_sound);

            if (port.status() != nxt_sound) {
                // Failed to load lego-nxt-sound friver. Wrong port?
                _path.clear();
            }
        } else {
            _path.clear();
        }
    }
}